

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

void acutest_begin_test_line_(acutest_test_ *test)

{
  undefined1 local_48 [8];
  char spaces [48];
  int n;
  acutest_test_ *test_local;
  
  if (acutest_tap_ == 0) {
    if (acutest_verbose_level_ < 3) {
      if (acutest_verbose_level_ < 1) {
        acutest_test_already_logged_ = 1;
      }
      else {
        spaces._44_4_ = acutest_colored_printf_(10,"Test %s... ",test->name);
        memset(local_48,0x20,0x30);
        if ((int)spaces._44_4_ < 0x30) {
          printf("%.*s",(ulong)(0x30 - spaces._44_4_),local_48);
        }
      }
    }
    else {
      acutest_colored_printf_(10,"Test %s:\n",test->name);
      acutest_test_already_logged_ = acutest_test_already_logged_ + 1;
    }
  }
  return;
}

Assistant:

static void
acutest_begin_test_line_(const struct acutest_test_* test)
{
    if(!acutest_tap_) {
        if(acutest_verbose_level_ >= 3) {
            acutest_colored_printf_(ACUTEST_COLOR_DEFAULT_INTENSIVE_, "Test %s:\n", test->name);
            acutest_test_already_logged_++;
        } else if(acutest_verbose_level_ >= 1) {
            int n;
            char spaces[48];

            n = acutest_colored_printf_(ACUTEST_COLOR_DEFAULT_INTENSIVE_, "Test %s... ", test->name);
            memset(spaces, ' ', sizeof(spaces));
            if(n < (int) sizeof(spaces))
                printf("%.*s", (int) sizeof(spaces) - n, spaces);
        } else {
            acutest_test_already_logged_ = 1;
        }
    }
}